

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O0

void * tommy_allocator_alloc(tommy_allocator *alloc)

{
  long lVar1;
  tommy_allocator_entry_struct *ptVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  tommy_allocator_entry *free_block;
  tommy_allocator_entry *segment;
  char *data;
  tommy_size_t size;
  tommy_uintptr_t mis;
  tommy_uintptr_t off;
  void *ptr;
  tommy_allocator *alloc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (alloc->free_block == (tommy_allocator_entry_struct *)0x0) {
    data = (char *)0xfc0;
    if (0xfc0 < alloc->align_size + 8 + alloc->block_size) {
      data = (char *)(alloc->align_size + 8 + alloc->block_size);
    }
    ptVar2 = (tommy_allocator_entry_struct *)lrtr_malloc((size_t)data);
    ptVar2->next = alloc->used_segment;
    alloc->used_segment = ptVar2;
    segment = ptVar2 + 1;
    uVar3 = (ulong)segment % alloc->align_size;
    if (uVar3 != 0) {
      segment = (tommy_allocator_entry *)((alloc->align_size - uVar3) + (long)segment);
      data = data + -(alloc->align_size - uVar3);
    }
    do {
      segment->next = alloc->free_block;
      alloc->free_block = segment;
      segment = (tommy_allocator_entry *)((long)&segment->next + alloc->block_size);
      data = data + -alloc->block_size;
    } while ((char *)alloc->block_size <= data);
  }
  ptVar2 = alloc->free_block;
  alloc->free_block = alloc->free_block->next;
  alloc->count = alloc->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return ptVar2;
}

Assistant:

void* tommy_allocator_alloc(tommy_allocator* alloc)
{
	void* ptr;

	/* if no free block available */
	if (!alloc->free_block) {
		tommy_uintptr_t off, mis;
		tommy_size_t size;
		char* data;
		tommy_allocator_entry* segment;

		/* default allocation size */
		size = TOMMY_ALLOCATOR_BLOCK_SIZE;

		/* ensure that we can allocate at least one block */
		if (size < sizeof(tommy_allocator_entry) + alloc->align_size + alloc->block_size)
			size = sizeof(tommy_allocator_entry) + alloc->align_size + alloc->block_size;

		data = tommy_cast(char*, tommy_malloc(size));
		segment = (tommy_allocator_entry*)data;

		/* put in the segment list */
		segment->next = alloc->used_segment;
		alloc->used_segment = segment;
		data += sizeof(tommy_allocator_entry);

		/* align if not aligned */
		off = (tommy_uintptr_t)data;
		mis = off % alloc->align_size;
		if (mis != 0) {
			data += alloc->align_size - mis;
			size -= alloc->align_size - mis;
		}

		/* insert in free list */
		do {
			tommy_allocator_entry* free_block = (tommy_allocator_entry*)data;
			free_block->next = alloc->free_block;
			alloc->free_block = free_block;

			data += alloc->block_size;
			size -= alloc->block_size;
		} while (size >= alloc->block_size);
	}

	/* remove one from the free list */
	ptr = alloc->free_block;
	alloc->free_block = alloc->free_block->next;

	++alloc->count;

	return ptr;
}